

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

int xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt,xmlDocPtr instance)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlNodePtr cur;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlNodePtr cur_00;
  xmlSchematronTestPtr_conflict pxVar5;
  xmlSchematronRulePtr_conflict pxVar6;
  xmlSchematronRulePtr_conflict pxVar7;
  char local_418 [1000];
  
  iVar2 = -1;
  if ((((ctxt != (xmlSchematronValidCtxtPtr)0x0) && (ctxt->schema != (xmlSchematronPtr)0x0)) &&
      (instance != (xmlDocPtr)0x0)) && (ctxt->schema->rules != (xmlSchematronRulePtr_conflict)0x0))
  {
    ctxt->nberrors = 0;
    cur = xmlDocGetRootElement(instance);
    if (cur == (xmlNodePtr)0x0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/schematron.c"
                ,0x68f);
      ctxt->nberrors = ctxt->nberrors + 1;
      iVar2 = 1;
    }
    else {
      if (ctxt->flags == 0 || (ctxt->flags & 1U) != 0) {
        for (; cur != (xmlNodePtr)0x0; cur = xmlSchematronNextNode(cur)) {
          pxVar6 = (xmlSchematronRulePtr_conflict)&ctxt->schema->rules;
          while (pxVar6 = pxVar6->next, pxVar6 != (xmlSchematronRulePtr_conflict)0x0) {
            iVar2 = xmlPatternMatch(pxVar6->pattern,cur);
            if (iVar2 == 1) {
              pxVar5 = (xmlSchematronTestPtr_conflict)&pxVar6->tests;
              while (pxVar5 = pxVar5->next, pxVar5 != (xmlSchematronTestPtr_conflict)0x0) {
                xmlSchematronRunTest
                          (ctxt,pxVar5,instance,cur,
                           (xmlSchematronPatternPtr_conflict)pxVar6->pattern);
              }
            }
          }
        }
      }
      else {
        pxVar6 = (xmlSchematronRulePtr_conflict)&ctxt->schema->patterns;
        while (pxVar6 = (xmlSchematronRulePtr_conflict)
                        ((xmlSchematronPatternPtr_conflict)pxVar6)->next,
              pxVar6 != (xmlSchematronRulePtr_conflict)0x0) {
          cur_00 = cur;
          if ((ctxt->flags & 9U) == 0) {
            if ((ctxt->flags & 4U) == 0) {
              if (pxVar6->node != (xmlNodePtr)0x0) {
                snprintf(local_418,999,"Pattern: %s\n");
                fputs(local_418,_stderr);
              }
            }
            else {
              pp_Var3 = __xmlGenericError();
              p_Var1 = *pp_Var3;
              ppvVar4 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/schematron.c"
                        ,0x5b1);
            }
          }
          for (; pxVar7 = pxVar6, cur_00 != (xmlNodePtr)0x0; cur_00 = xmlSchematronNextNode(cur_00))
          {
            while (pxVar7 = pxVar7->patnext, pxVar7 != (xmlSchematronRulePtr_conflict)0x0) {
              iVar2 = xmlPatternMatch(pxVar7->pattern,cur_00);
              if (iVar2 == 1) {
                pxVar5 = (xmlSchematronTestPtr_conflict)&pxVar7->tests;
                while (pxVar5 = pxVar5->next, pxVar5 != (xmlSchematronTestPtr_conflict)0x0) {
                  xmlSchematronRunTest
                            (ctxt,pxVar5,instance,cur_00,(xmlSchematronPatternPtr_conflict)pxVar6);
                }
              }
            }
          }
        }
      }
      iVar2 = ctxt->nberrors;
    }
  }
  return iVar2;
}

Assistant:

int
xmlSchematronValidateDoc(xmlSchematronValidCtxtPtr ctxt, xmlDocPtr instance)
{
    xmlNodePtr cur, root;
    xmlSchematronPatternPtr pattern;
    xmlSchematronRulePtr rule;
    xmlSchematronTestPtr test;

    if ((ctxt == NULL) || (ctxt->schema == NULL) ||
        (ctxt->schema->rules == NULL) || (instance == NULL))
        return(-1);
    ctxt->nberrors = 0;
    root = xmlDocGetRootElement(instance);
    if (root == NULL) {
        TODO
	ctxt->nberrors++;
	return(1);
    }
    if ((ctxt->flags & XML_SCHEMATRON_OUT_QUIET) ||
        (ctxt->flags == 0)) {
	/*
	 * we are just trying to assert the validity of the document,
	 * speed primes over the output, run in a single pass
	 */
	cur = root;
	while (cur != NULL) {
	    rule = ctxt->schema->rules;
	    while (rule != NULL) {
		if (xmlPatternMatch(rule->pattern, cur) == 1) {
		    test = rule->tests;
		    while (test != NULL) {
			xmlSchematronRunTest(ctxt, test, instance, cur, (xmlSchematronPatternPtr)rule->pattern);
			test = test->next;
		    }
		}
		rule = rule->next;
	    }

	    cur = xmlSchematronNextNode(cur);
	}
    } else {
        /*
	 * Process all contexts one at a time
	 */
	pattern = ctxt->schema->patterns;

	while (pattern != NULL) {
	    xmlSchematronReportPattern(ctxt, pattern);

	    /*
	     * TODO convert the pattern rule to a direct XPath and
	     * compute directly instead of using the pattern matching
	     * over the full document...
	     * Check the exact semantic
	     */
	    cur = root;
	    while (cur != NULL) {
		rule = pattern->rules;
		while (rule != NULL) {
		    if (xmlPatternMatch(rule->pattern, cur) == 1) {
			test = rule->tests;
			while (test != NULL) {
			    xmlSchematronRunTest(ctxt, test, instance, cur, pattern);
			    test = test->next;
			}
		    }
		    rule = rule->patnext;
		}

		cur = xmlSchematronNextNode(cur);
	    }
	    pattern = pattern->next;
	}
    }
    return(ctxt->nberrors);
}